

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
::set_empty_key(dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
                *this,key_type *key)

{
  key_type pcVar1;
  size_type sVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  pointer ppcVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_empty_ =
       true;
  pcVar1 = *key;
  (this->key_info).empty_key = pcVar1;
  sVar2 = this->num_buckets;
  piVar3 = (this->val_info).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_;
  if (piVar3 != (int *)0x0) {
    *piVar3 = *piVar3 + 1;
  }
  ppcVar5 = (pointer)malloc(sVar2 * 8);
  this->table = ppcVar5;
  auVar4 = _DAT_00a8f670;
  if (sVar2 != 0) {
    lVar7 = sVar2 - 1;
    auVar8._8_4_ = (int)lVar7;
    auVar8._0_8_ = lVar7;
    auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar6 = 0;
    auVar8 = auVar8 ^ _DAT_00a8f670;
    auVar9 = _DAT_00a8f660;
    do {
      auVar10 = auVar9 ^ auVar4;
      if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                  auVar8._4_4_ < auVar10._4_4_) & 1)) {
        ppcVar5[uVar6] = pcVar1;
      }
      if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
          auVar10._12_4_ <= auVar8._12_4_) {
        ppcVar5[uVar6 + 1] = pcVar1;
      }
      uVar6 = uVar6 + 2;
      lVar7 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar7 + 2;
    } while ((sVar2 + 1 & 0xfffffffffffffffe) != uVar6);
  }
  return;
}

Assistant:

void set_empty_key(const key_type& key) {
    // Once you set the empty key, you can't change it
    assert(!settings.use_empty() && "Calling set_empty_key multiple times");
    // The deleted indicator (if specified) and the empty indicator
    // must be different.
    assert(
        (!settings.use_deleted() || !equals(key, key_info.delkey)) &&
        "Setting the empty key the same as the deleted key");
    settings.set_use_empty(true);
    key_info.empty_key = key;

    assert(!table);  // must set before first use
    // num_buckets was set in constructor even though table was NULL
    table = val_info.allocate(num_buckets);
    assert(table);
    fill_range_with_empty(table, num_buckets);
  }